

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

bool __thiscall
QOpenGLShaderProgram::addShaderFromSourceFile
          (QOpenGLShaderProgram *this,ShaderType type,QString *fileName)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  int iVar6;
  QOpenGLShader *this_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  iVar6 = init(this,(EVP_PKEY_CTX *)
                    CONCAT44(in_register_00000034,
                             type.super_QFlagsStorageHelper<QOpenGLShader::ShaderTypeBit,_4>.
                             super_QFlagsStorage<QOpenGLShader::ShaderTypeBit>.i));
  if ((char)iVar6 != '\0') {
    this_00 = (QOpenGLShader *)operator_new(0x10);
    QOpenGLShader::QOpenGLShader(this_00,type,&this->super_QObject);
    bVar5 = QOpenGLShader::compileSourceFile(this_00,fileName);
    if (bVar5) {
      QList<QOpenGLShader_*>::append((QList<QOpenGLShader_*> *)(lVar1 + 0xb8),this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        bVar5 = addShader(this,this_00);
        return bVar5;
      }
      goto LAB_00148f85;
    }
    QOpenGLShader::log((QOpenGLShader *)&local_48,
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    pDVar3 = *(Data **)(lVar1 + 0x88);
    pcVar4 = *(char16_t **)(lVar1 + 0x90);
    *(Data **)(lVar1 + 0x88) = local_48.d;
    *(char16_t **)(lVar1 + 0x90) = local_48.ptr;
    qVar2 = *(qsizetype *)(lVar1 + 0x98);
    *(qsizetype *)(lVar1 + 0x98) = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pcVar4;
    local_48.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return false;
  }
LAB_00148f85:
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShaderFromSourceFile
    (QOpenGLShader::ShaderType type, const QString& fileName)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    QOpenGLShader *shader = new QOpenGLShader(type, this);
    if (!shader->compileSourceFile(fileName)) {
        d->log = shader->log();
        delete shader;
        return false;
    }
    d->anonShaders.append(shader);
    return addShader(shader);
}